

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

int __thiscall ktx::OptionsSingleIn::init(OptionsSingleIn *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  OptionAdder *__a;
  shared_ptr<cxxopts::Value> *in_stack_fffffffffffffda8;
  string *help_text;
  shared_ptr<const_cxxopts::Value> *in_stack_fffffffffffffdb0;
  Options *pOVar2;
  allocator<char> *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [8];
  undefined8 in_stack_fffffffffffffe48;
  Options *in_stack_fffffffffffffe50;
  allocator<char> local_199;
  string local_198 [71];
  allocator<char> local_151;
  string local_150 [32];
  string *in_stack_fffffffffffffed0;
  shared_ptr<const_cxxopts::Value> *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  OptionAdder *in_stack_fffffffffffffef0;
  allocator<char> local_101;
  string local_100 [71];
  undefined1 local_b9 [40];
  allocator<char> local_91;
  string local_90 [55];
  undefined1 local_59 [73];
  string *local_10;
  undefined8 local_8;
  
  pOVar2 = (Options *)local_59;
  local_10 = (string *)ctx;
  local_8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  cxxopts::Options::add_options(pOVar2,(string *)ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  __s = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffde0);
  __a = cxxopts::OptionAdder::operator()
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)__a);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)__a);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x27f36a);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x27f377);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x27f3d2);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x27f3df);
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  cxxopts::OptionAdder::~OptionAdder((OptionAdder *)0x27f420);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)__a);
  cxxopts::Options::parse_positional(in_stack_fffffffffffffe50,(string *)in_stack_fffffffffffffe48);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  pOVar2 = (Options *)&local_1e9;
  help_text = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)__a);
  cxxopts::Options::positional_help(pOVar2,help_text);
  std::__cxx11::string::~string(local_1e8);
  iVar1 = std::allocator<char>::~allocator(&local_1e9);
  return iVar1;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options()
                ("stdin", "Use stdin as the input file. (Using a single dash '-' as the input file has the same effect)")
                ("i,input-file", "The input file. Using a single dash '-' as the input file will use stdin.", cxxopts::value<std::string>(), "filepath");
        opts.parse_positional("input-file");
        opts.positional_help("<input-file>");
    }